

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O2

void generalMultTest1(int dim,int dl)

{
  CSC *pCVar1;
  pointer pdVar2;
  int nnz;
  Matrix *pMVar3;
  CSR *pCVar4;
  Matrix *pMVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  diagonal *this;
  int iVar9;
  pointer pdVar10;
  bool bVar11;
  double durationSym1;
  Matrix *local_138;
  Matrix *local_130;
  Matrix *local_128;
  CSC *local_120;
  Matrix *local_118;
  CSR *local_110;
  vector<double,_std::allocator<double>_> tm4;
  vector<double,_std::allocator<double>_> tm3;
  vector<double,_std::allocator<double>_> tm2;
  vector<double,_std::allocator<double>_> tm1;
  string local_90;
  string local_70;
  string local_50;
  
  tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar3 = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_50," ",(allocator *)&durationSym1);
  Matrix::Matrix(pMVar3,dim,dim,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"diagonal",(allocator *)&durationSym1);
  Matrix::Random(pMVar3,dl,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  Matrix::LowerTriangular(pMVar3);
  pCVar4 = (CSR *)operator_new(0x30);
  CSR::CSR(pCVar4,pMVar3);
  pMVar5 = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_90,"vector:",(allocator *)&durationSym1);
  Matrix::Matrix(pMVar5,dim,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Matrix::Random(pMVar5);
  local_138 = (Matrix *)CONCAT44(local_138._4_4_,dim);
  local_128 = (Matrix *)CONCAT44(local_128._4_4_,dl);
  iVar9 = 5;
  local_130 = pMVar5;
  local_118 = pMVar3;
  local_110 = pCVar4;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar3 = CSR::csrMult(local_110,local_130);
    lVar7 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar7 - lVar6) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&tm1,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start,
             tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  iVar9 = (int)local_138;
  poVar8 = std::operator<<((ostream *)&std::cout,"multiply(CSR)");
  std::operator<<(poVar8,",");
  pdVar2 = tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = tm1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar8 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar8," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pCVar4 = local_110;
  nnz = CSR::turntoCSC(local_110);
  local_120 = (CSC *)operator_new(0x30);
  CSC::CSC(local_120,iVar9,iVar9,nnz,pCVar4->ptr,pCVar4->idx,pCVar4->val);
  iVar9 = 5;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar3 = CSC::cscMult(local_120,local_130);
    lVar7 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar7 - lVar6) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&tm2,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start,
             tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  iVar9 = (int)local_138;
  poVar8 = std::operator<<((ostream *)&std::cout,"multiply(CSC)");
  std::operator<<(poVar8,",");
  pdVar2 = tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar8 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar8," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  this = (diagonal *)operator_new(0x18);
  diagonal::diagonal(this,iVar9,iVar9,(int)local_128);
  local_138 = diagonal::diaStore(this,local_118,1);
  diagonal::offsetCompute(this,1);
  iVar9 = 5;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar3 = diagonal::diaMult(this,local_138,local_130);
    lVar7 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar7 - lVar6) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&tm3,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start,
             tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  poVar8 = std::operator<<((ostream *)&std::cout,"multiply(dia1)");
  std::operator<<(poVar8,",");
  pdVar2 = tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar8 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar8," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  local_128 = diagonal::diaStore2(this,local_118,1);
  iVar9 = 5;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar3 = diagonal::diaMult2(this,local_128,local_130);
    lVar7 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar7 - lVar6) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&tm4,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start,
             tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  poVar8 = std::operator<<((ostream *)&std::cout,"multiply(dia2)");
  std::operator<<(poVar8,",");
  pdVar2 = tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar8 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar8," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar3 = local_118;
  Matrix::~Matrix(local_118);
  operator_delete(pMVar3,0x30);
  pCVar4 = local_110;
  CSR::~CSR(local_110);
  operator_delete(pCVar4,0x30);
  pMVar3 = local_130;
  Matrix::~Matrix(local_130);
  operator_delete(pMVar3,0x30);
  pCVar1 = local_120;
  CSC::~CSC(local_120);
  operator_delete(pCVar1,0x30);
  diagonal::~diagonal(this);
  operator_delete(this,0x18);
  pMVar5 = local_128;
  pMVar3 = local_138;
  if (local_138 != (Matrix *)0x0) {
    Matrix::~Matrix(local_138);
  }
  operator_delete(pMVar3,0x30);
  if (pMVar5 != (Matrix *)0x0) {
    Matrix::~Matrix(pMVar5);
  }
  operator_delete(pMVar5,0x30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tm4.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tm3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tm2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tm1.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void generalMultTest1(int dim, int dl)
{
    // 5for rows - 2 for dia
    vector<double> tm1;
    vector<double> tm2;
    vector<double> tm3;
    vector<double> tm4;
    Matrix *dia1 = new Matrix(dim,dim," ");
    dia1->Random(dl,"diagonal");
    dia1->LowerTriangular();
    // dia1->print();

    //save matrix in csr format
    CSR *cr1 = new CSR(dia1);
    // cr1->triplet();
    Matrix *v1 = new Matrix(dim,1,"vector:");
     v1->Random();


    //execution time-start
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = cr1->csrMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym1=elapsed_seconds.count();
         //cout<<"execution time(CSR):"<< durationSym1<<"\n";
        //execution time-end
        //result1->print();
        tm1.push_back(durationSym1);
        delete result1;
    }
    sort(tm1.begin(), tm1.end());
    cout << "multiply(CSR)"<<",";
    for (auto x : tm1)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in csc format
      int nnz = cr1->turntoCSC();
      CSC *cc1 = new CSC(dim,dim, nnz, cr1->ptr, cr1->idx, cr1->val);
    // cc1->Triplet();

    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = cc1->cscMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym2=elapsed_seconds.count();
        // cout<<"execution time(CSC):"<< durationSym2 <<"\n";
        //execution time-end
        // result2->print();
        tm2.push_back(durationSym2);
        delete result2;
    }
    sort(tm2.begin(), tm2.end());
    cout << "multiply(CSC)"<<",";
    for (auto x : tm2)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in diagonal format
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia1,1);
    d1->offsetCompute(1);
    //  d2->print();
    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = d1->diaMult(d2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //  cout << "execution time (dia):" << durationSym3 << "\n";
        //execution time-end
        //  result3->print();
        tm3.push_back(durationSym3);
        delete result3;
    }
    sort(tm3.begin(), tm3.end());
    cout << "multiply(dia1)"<<",";
    for (auto x : tm3)
        cout << x << " ,";
    cout<<"\n";

// diagonal2
    Matrix *m2 = d1->diaStore2(dia1, 1);
    // m2->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = d1->diaMult2(m2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
       //  cout << "execution time (dia2):" << durationSym4 << "\n";
        //result4->print();
        tm4.push_back(durationSym4);
        delete result4;
    }
    sort(tm4.begin(), tm4.end());
    cout << "multiply(dia2)"<<",";
    for (auto x : tm4)
        cout << x << " ,";
    cout<<"\n";

    //testing the result
    /*bool  t1 = result1->isequal(result2);
    bool  t2 = result2->isequal(result3);
    bool  t3 = result2->isequal(result4);
    bool  t4 = result3->isequal(result4);
    bool  t5 = result1->isequal(result4);
    cout << "the result of multiply of csc & csr & dia & dia2 is:"<< t1 <<","<< t2 << "," << t3<<"," << t4<<"," << t5<<"\n";

    cout<<  "\n";*/

    delete dia1;
    delete cr1;
    delete v1;
    delete cc1;
    delete d1;
    delete d2;
    delete m2;

}